

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall SQDelegable::SetDelegate(SQDelegable *this,SQTable *mt)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  SQTable *temp;
  
  pSVar2 = mt;
  if (mt == (SQTable *)this) {
    return false;
  }
  do {
    if (pSVar2 == (SQTable *)0x0) {
      if (mt != (SQTable *)0x0) {
        pSVar1 = &(mt->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar2 = this->_delegate;
      if (pSVar2 != (SQTable *)0x0) {
        pSVar1 = &(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
        this->_delegate = (SQTable *)0x0;
      }
      this->_delegate = mt;
      return true;
    }
    pSVar2 = (pSVar2->super_SQDelegable)._delegate;
  } while (pSVar2 != (SQTable *)this);
  return false;
}

Assistant:

bool SQDelegable::SetDelegate(SQTable *mt)
{
    SQTable *temp = mt;
    if(temp == this) return false;
    while (temp) {
        if (temp->_delegate == this) return false; //cycle detected
        temp = temp->_delegate;
    }
    if (mt) __ObjAddRef(mt);
    __ObjRelease(_delegate);
    _delegate = mt;
    return true;
}